

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

ComponentData * __thiscall
HighsSymmetryDetection::computeComponentData
          (ComponentData *__return_storage_ptr__,HighsSymmetryDetection *this,
          HighsSymmetries *symmetries)

{
  vector<int,std::allocator<int>> *pvVar1;
  HighsInt *__args;
  int *piVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pdqsort_detail *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  iterator iVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_00;
  bool bVar8;
  HighsInt HVar9;
  ulong uVar10;
  int iVar11;
  HighsSymmetryDetection *pHVar12;
  long lVar13;
  long lVar14;
  anon_class_16_2_164db4ee comp;
  HighsInt numUsedPerms;
  HighsInt currentComponent;
  HighsInt currentComponentStart;
  HighsHashTable<int,_void> currComponentOrbits;
  undefined1 in_stack_ffffffffffffff68;
  int local_94;
  int local_90;
  int local_8c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  HighsSymmetries *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  vector<int,_std::allocator<int>_> *local_70;
  vector<int,std::allocator<int>> *local_68;
  vector<int,std::allocator<int>> *local_60;
  HighsHashTable<int,_void> local_58;
  
  memset(__return_storage_ptr__,0,0x108);
  local_88._M_current = (int *)__return_storage_ptr__;
  HighsDisjointSets<false>::reset(&__return_storage_ptr__->components,this->numActiveCols);
  local_78 = &__return_storage_ptr__->firstUnfixed;
  local_58.entries._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>.
  _M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>.
  super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (local_78,(long)symmetries->numPerms,(value_type_conflict2 *)&local_58);
  local_58.entries._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>.
  _M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>.
  super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&__return_storage_ptr__->numUnfixed,(long)symmetries->numPerms,
             (value_type_conflict2 *)&local_58);
  __args = &this->numActiveCols;
  if (0 < symmetries->numPerms) {
    lVar14 = 0;
    local_80 = symmetries;
    do {
      iVar11 = *__args;
      if (0 < iVar11) {
        piVar4 = (local_80->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = 0;
        do {
          iVar3 = piVar4[iVar11 * (int)lVar14 + lVar13];
          if (iVar3 != (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar13]) {
            HVar9 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3];
            piVar2 = (__return_storage_ptr__->numUnfixed).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start + lVar14;
            *piVar2 = *piVar2 + 1;
            piVar5 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            iVar3 = piVar5[lVar14];
            if (iVar3 == -1) {
              piVar5[lVar14] = HVar9;
            }
            else {
              HighsDisjointSets<false>::merge
                        ((HighsDisjointSets<false> *)local_88._M_current,iVar3,HVar9);
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < *__args);
      }
      lVar14 = lVar14 + 1;
      symmetries = local_80;
    } while (lVar14 < local_80->numPerms);
  }
  end_00._M_current = local_88._M_current;
  pvVar1 = (vector<int,std::allocator<int>> *)(local_88._M_current + 0x18);
  piVar4 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<int,std::allocator<int>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (pvVar1,piVar4,piVar4 + this->numActiveCols);
  this_00 = *(pdqsort_detail **)(end_00._M_current + 0x18);
  _Var6._M_current = end_00._M_current[0x1a];
  if (this_00 != (pdqsort_detail *)_Var6._M_current) {
    uVar10 = (long)_Var6._M_current - (long)this_00 >> 2;
    pHVar12 = (HighsSymmetryDetection *)0x0;
    if (1 < uVar10) {
      pHVar12 = (HighsSymmetryDetection *)0x0;
      do {
        uVar10 = (long)uVar10 >> 1;
        pHVar12 = (HighsSymmetryDetection *)(ulong)((int)pHVar12 + 1);
      } while (1 < uVar10);
    }
    comp.this = pHVar12;
    comp.componentData = (ComponentData *)this;
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0,false>
              (this_00,_Var6,end_00,comp,1,(bool)in_stack_ffffffffffffff68);
  }
  local_8c = -1;
  local_90 = -1;
  HighsHashTable<int,_void>::HighsHashTable(&local_58);
  if (0 < *__args) {
    local_60 = (vector<int,std::allocator<int>> *)(end_00._M_current + 0x12);
    local_68 = (vector<int,std::allocator<int>> *)(end_00._M_current + 0x24);
    local_70 = (vector<int,_std::allocator<int>_> *)(end_00._M_current + 0x1e);
    lVar14 = 0;
    do {
      HVar9 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end_00._M_current,
                         (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start
                         [*(int *)(*(long *)(end_00._M_current + 0x18) + lVar14 * 4)]);
      if (*(int *)(*(long *)end_00._M_current + (long)HVar9 * 4) == 1) break;
      if (HVar9 != local_90) {
        local_8c = (int)lVar14;
        iVar7._M_current = end_00._M_current[0x14];
        local_90 = HVar9;
        if (iVar7._M_current == *(int **)(end_00._M_current + 0x16)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_60,iVar7,&local_8c);
        }
        else {
          *iVar7._M_current = local_8c;
          *(int **)(end_00._M_current + 0x14) = iVar7._M_current + 1;
        }
        iVar7._M_current = end_00._M_current[0x26];
        if (iVar7._M_current == *(int **)(end_00._M_current + 0x28)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_68,iVar7,&local_90);
        }
        else {
          *iVar7._M_current = local_90;
          *(int **)(end_00._M_current + 0x26) = iVar7._M_current + 1;
        }
        iVar7._M_current = end_00._M_current[0x20];
        if (iVar7._M_current == *(int **)(end_00._M_current + 0x22)) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<>(local_70,iVar7);
        }
        else {
          *iVar7._M_current = 0;
          *(int **)(end_00._M_current + 0x20) = iVar7._M_current + 1;
        }
        HighsHashTable<int,_void>::clear(&local_58);
      }
      local_94 = getOrbit(this,*(HighsInt *)(*(long *)pvVar1 + lVar14 * 4));
      bVar8 = HighsHashTable<int,_void>::insert<int>(&local_58,&local_94);
      if (bVar8) {
        *(int *)(*(long *)(end_00._M_current + 0x20) + -4) =
             *(int *)(*(long *)(end_00._M_current + 0x20) + -4) + 1;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < *__args);
  }
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)(end_00._M_current + 0x30),
             (long)symmetries->numPerms);
  local_94 = 0;
  if (0 < symmetries->numPerms) {
    do {
      if ((local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_94] != -1) {
        iVar7._M_current = end_00._M_current[0x32];
        if (iVar7._M_current == *(int **)(end_00._M_current + 0x34)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)(end_00._M_current + 0x30),iVar7,&local_94);
        }
        else {
          *iVar7._M_current = local_94;
          *(int **)(end_00._M_current + 0x32) = iVar7._M_current + 1;
        }
      }
      local_94 = local_94 + 1;
    } while (local_94 < symmetries->numPerms);
  }
  _Var6._M_current = end_00._M_current[0x30];
  end._M_current = end_00._M_current[0x32];
  if (_Var6._M_current != end._M_current) {
    uVar10 = (long)end._M_current - (long)_Var6._M_current >> 2;
    iVar11 = 0;
    if (1 < uVar10) {
      iVar11 = 0;
      do {
        uVar10 = (long)uVar10 >> 1;
        iVar11 = iVar11 + 1;
      } while (1 < uVar10);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1,false>
              (_Var6,end,(anon_class_8_1_56ae1867)end_00._M_current,iVar11,true);
  }
  local_8c = -1;
  local_90 = -1;
  local_94 = (int)((ulong)(*(long *)(end_00._M_current + 0x32) - *(long *)(end_00._M_current + 0x30)
                          ) >> 2);
  if (0 < local_94) {
    lVar14 = 0;
    do {
      HVar9 = HighsDisjointSets<false>::getSet
                        ((HighsDisjointSets<false> *)end_00._M_current,
                         *(HighsInt *)
                          (*(long *)(end_00._M_current + 0x36) +
                          (long)*(int *)(*(long *)(end_00._M_current + 0x30) + lVar14 * 4) * 4));
      if (HVar9 != local_90) {
        local_8c = (int)lVar14;
        iVar7._M_current = end_00._M_current[0x2c];
        local_90 = HVar9;
        if (iVar7._M_current == *(int **)(end_00._M_current + 0x2e)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)(end_00._M_current + 0x2a),iVar7,&local_8c);
        }
        else {
          *iVar7._M_current = local_8c;
          *(int **)(end_00._M_current + 0x2c) = iVar7._M_current + 1;
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < local_94);
  }
  iVar7._M_current = end_00._M_current[0x2c];
  if (iVar7._M_current == *(int **)(end_00._M_current + 0x2e)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)(end_00._M_current + 0x2a),iVar7,&local_94);
  }
  else {
    *iVar7._M_current = local_94;
    *(int **)(end_00._M_current + 0x2c) = iVar7._M_current + 1;
  }
  iVar7._M_current = end_00._M_current[0x14];
  if (iVar7._M_current == *(int **)(end_00._M_current + 0x16)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)(end_00._M_current + 0x12),iVar7,__args);
  }
  else {
    *iVar7._M_current = *__args;
    *(int **)(end_00._M_current + 0x14) = iVar7._M_current + 1;
  }
  HighsHashTable<int,_void>::~HighsHashTable(&local_58);
  return (ComponentData *)end_00._M_current;
}

Assistant:

HighsSymmetryDetection::ComponentData
HighsSymmetryDetection::computeComponentData(
    const HighsSymmetries& symmetries) {
  ComponentData componentData;

  componentData.components.reset(numActiveCols);
  componentData.firstUnfixed.assign(symmetries.numPerms, -1);
  componentData.numUnfixed.assign(symmetries.numPerms, 0);
  for (HighsInt i = 0; i < symmetries.numPerms; ++i) {
    const HighsInt* perm = symmetries.permutations.data() + i * numActiveCols;

    for (HighsInt j = 0; j < numActiveCols; ++j) {
      if (perm[j] != vertexGroundSet[j]) {
        HighsInt pos = vertexPosition[perm[j]];
        componentData.numUnfixed[i] += 1;
        if (componentData.firstUnfixed[i] != -1)
          componentData.components.merge(componentData.firstUnfixed[i], pos);
        else
          componentData.firstUnfixed[i] = pos;
      }
    }
  }

  componentData.componentSets.assign(vertexGroundSet.begin(),
                                     vertexGroundSet.begin() + numActiveCols);
  pdqsort(componentData.componentSets.begin(),
          componentData.componentSets.end(), [&](HighsInt u, HighsInt v) {
            HighsInt uComp = componentData.components.getSet(vertexPosition[u]);
            HighsInt vComp = componentData.components.getSet(vertexPosition[v]);
            return std::make_pair(
                       componentData.components.getSetSize(uComp) == 1, uComp) <
                   std::make_pair(
                       componentData.components.getSetSize(vComp) == 1, vComp);
          });

  HighsInt currentComponentStart = -1;
  HighsInt currentComponent = -1;
  HighsHashTable<HighsInt> currComponentOrbits;
  for (HighsInt i = 0; i < numActiveCols; ++i) {
    HighsInt comp = componentData.components.getSet(
        vertexPosition[componentData.componentSets[i]]);
    if (componentData.components.getSetSize(comp) == 1) break;
    if (comp != currentComponent) {
      currentComponent = comp;
      currentComponentStart = i;
      componentData.componentStarts.push_back(currentComponentStart);
      componentData.componentNumber.push_back(currentComponent);
      componentData.componentNumOrbits.emplace_back();
      currComponentOrbits.clear();
    }

    if (currComponentOrbits.insert(getOrbit(componentData.componentSets[i]))) {
      ++componentData.componentNumOrbits.back();
    }
  }

  componentData.permComponents.reserve(symmetries.numPerms);

  for (HighsInt i = 0; i < symmetries.numPerms; ++i) {
    if (componentData.firstUnfixed[i] == -1) continue;
    componentData.permComponents.push_back(i);
  }

  pdqsort(componentData.permComponents.begin(),
          componentData.permComponents.end(), [&](HighsInt i, HighsInt j) {
            HighsInt seti =
                componentData.components.getSet(componentData.firstUnfixed[i]);
            HighsInt setj =
                componentData.components.getSet(componentData.firstUnfixed[j]);
            return std::make_pair(seti, componentData.numUnfixed[i]) <
                   std::make_pair(setj, componentData.numUnfixed[j]);
          });

  currentComponentStart = -1;
  currentComponent = -1;

  HighsInt numUsedPerms = componentData.permComponents.size();

  for (HighsInt i = 0; i < numUsedPerms; ++i) {
    HighsInt p = componentData.permComponents[i];
    HighsInt comp =
        componentData.components.getSet(componentData.firstUnfixed[p]);
    if (comp != currentComponent) {
      currentComponent = comp;
      currentComponentStart = i;
      componentData.permComponentStarts.push_back(currentComponentStart);
    }
  }

  assert(componentData.permComponentStarts.size() ==
         componentData.componentStarts.size());
  componentData.permComponentStarts.push_back(numUsedPerms);

  // HighsInt numComponents = componentData.componentStarts.size();
  // printf("found %d components\n", numComponents);
  componentData.componentStarts.push_back(numActiveCols);

  return componentData;
}